

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lab5.cpp
# Opt level: O0

void parse(ifstream *in,people *man)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  istream *piVar4;
  long lVar5;
  char *pcVar6;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [52];
  int local_3c;
  string local_38 [4];
  int i;
  string str;
  people *man_local;
  ifstream *in_local;
  
  std::__cxx11::string::string(local_38);
  for (local_3c = 0; local_3c < 0xc; local_3c = local_3c + 1) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)in,local_38,',');
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    if (bVar2) {
      switch(local_3c) {
      case 0:
        lVar5 = std::__cxx11::string::length();
        if (lVar5 != 0) {
          std::__cxx11::string::string(local_70,local_38);
          iVar3 = to_int((string *)local_70);
          man->id = iVar3;
          std::__cxx11::string::~string(local_70);
        }
        break;
      case 1:
        lVar5 = std::__cxx11::string::length();
        if (lVar5 != 0) {
          std::__cxx11::string::string(local_90,local_38);
          iVar3 = to_int((string *)local_90);
          man->surv = iVar3 + 1;
          std::__cxx11::string::~string(local_90);
        }
        break;
      case 2:
        lVar5 = std::__cxx11::string::length();
        if (lVar5 != 0) {
          std::__cxx11::string::string(local_b0,local_38);
          iVar3 = to_int((string *)local_b0);
          std::__cxx11::string::~string(local_b0);
          if (iVar3 == 1) {
            man->people_pclass = FIRST;
          }
          else if (iVar3 == 2) {
            man->people_pclass = SECOND;
          }
          else if (iVar3 == 3) {
            man->people_pclass = THIRD;
          }
        }
        break;
      case 5:
        lVar5 = std::__cxx11::string::length();
        if (lVar5 != 0) {
          pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
          if (*pcVar6 == 'f') {
            man->people_sex = FEMALE;
          }
          else if (*pcVar6 == 'm') {
            man->people_sex = MALE;
          }
        }
        break;
      case 6:
        lVar5 = std::__cxx11::string::length();
        if (lVar5 != 0) {
          std::__cxx11::string::string(local_d0,local_38);
          iVar3 = to_int((string *)local_d0);
          man->age = iVar3;
          std::__cxx11::string::~string(local_d0);
        }
      }
    }
  }
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)in,local_38,'\r');
  lVar5 = std::__cxx11::string::length();
  if (lVar5 != 0) {
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    cVar1 = *pcVar6;
    if (cVar1 == 'C') {
      man->people_state = CHERBOURG;
    }
    else if (cVar1 == 'Q') {
      man->people_state = QUEENSTOWN;
    }
    else if (cVar1 == 'S') {
      man->people_state = SOUTHAMPTON;
    }
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void parse(std::ifstream* in, people* man){
    std::string str;
    for (int i = 0; i < 12; i ++){
        if (getline(*in, str, ','))
        switch (i) {
            case 0:
                if (str.length())
                man->id = to_int(str);
                break;
            case 1:
                if (str.length())
                man->surv = to_int(str) + 1;
                break;
            case 2:
                if (str.length())
                switch (to_int(str)){
                    case 1:
                        man->people_pclass = FIRST;
                        break;
                    case 2:
                        man->people_pclass = SECOND;
                        break;
                    case 3:
                        man->people_pclass = THIRD;
                        break;
                }
                break;
            case 5:
                if (str.length())
                switch (str[0]) {
                    case 'm':
                        man->people_sex = MALE;
                        break;
                    case 'f':
                        man->people_sex = FEMALE;
                        break;
                }
                break;
            case 6:
                if (str.length())
                man->age = to_int(str);
                break;
        }

    }
    getline(*in, str, '\r');
    if (str.length())
    switch (str[0]){
        case 'S':
            man->people_state = SOUTHAMPTON;
            break;
        case 'Q':
            man->people_state = QUEENSTOWN;
            break;
        case 'C':
            man->people_state = CHERBOURG;
            break;
    }
}